

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

bool __thiscall
crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_node
          (tree_clusterizer<crnlib::vec<6U,_float>_> *this,
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
          *node_queue,uint *end_node,task_pool *pTask_pool)

{
  vq_node *pvVar1;
  uint uVar2;
  uint uVar3;
  pointer pNVar4;
  vq_node *pvVar5;
  vec<6U,_float> *pvVar6;
  VectorInfo *pVVar7;
  vec<6U,_float> *pvVar8;
  vq_node *pvVar9;
  int iVar10;
  int iVar11;
  task_pool *this_00;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  *this_01;
  _func_int **pp_Var12;
  uint i_4;
  int iVar13;
  ulong uVar14;
  executable_task *pObj;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  value_type *pvVar20;
  uint task;
  uint64 uVar21;
  ulong uVar22;
  value_type *pvVar23;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *pvVar24;
  ulong uVar25;
  uint i_3;
  undefined1 *puVar26;
  uint i_2;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *pvVar27;
  uint x;
  uint uVar28;
  uint i_14;
  long lVar29;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *pvVar30;
  uint uVar31;
  ulong uVar32;
  double dVar33;
  undefined1 auVar34 [16];
  float dist2;
  float fVar35;
  float fVar36;
  double dVar37;
  undefined1 auVar38 [16];
  float dist2_2;
  float fVar39;
  float dist2_3;
  vec<6U,_float> axis;
  vec<6U,_float> new_left_child;
  vec<6U,_float> right_child;
  vec<6U,_float> left_child;
  vec<6U,_float> result_6;
  vec<6U,_float> furthest;
  vec<6U,_float> new_right_child;
  vec<6U,_float> result;
  vec<6U,_float> opposite;
  float local_1ec;
  undefined1 local_1e8 [4];
  float afStack_1e4 [3];
  undefined8 local_1d8;
  undefined1 local_1c8 [8];
  float afStack_1c0 [2];
  undefined8 local_1b8 [2];
  task_pool *local_1a8;
  vq_node *local_1a0;
  ulong local_198;
  vq_node *local_190;
  undefined1 local_188 [40];
  float afStack_160 [4];
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *local_150;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *local_148;
  float local_140 [6];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  uint *local_110;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  *local_108;
  _func_int **local_100;
  float local_f8 [8];
  value_type local_d8;
  undefined1 *local_d0;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pNVar4 = (node_queue->c).
           super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pNVar4 != (node_queue->c).
                super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    uVar15 = pNVar4->m_index;
    pvVar5 = (this->m_nodes).m_p;
    pvVar1 = pvVar5 + uVar15;
    if (pvVar5[uVar15].m_alternative == true) {
      pvVar1->m_alternative = false;
    }
    if ((0.0 < pvVar1->m_variance) && (pvVar1->m_begin + 1 != pvVar1->m_end)) {
      local_1a8 = pTask_pool;
      std::
      priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
      ::pop(node_queue);
      if (pvVar1->m_processed == true) {
        if (pvVar1->m_unsplittable == false) {
          uVar15 = pvVar1->m_left;
          pvVar5 = (this->m_nodes).m_p;
          uVar2 = *end_node;
          if (uVar2 != uVar15) {
            lVar18 = 0;
            do {
              pvVar5[uVar2].m_centroid.m_s[lVar18] = pvVar5[uVar15].m_centroid.m_s[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
          }
          *(undefined4 *)((long)&pvVar5[uVar2].m_codebook_index + 3) =
               *(undefined4 *)((long)&pvVar5[uVar15].m_codebook_index + 3);
          uVar21 = pvVar5[uVar15].m_total_weight;
          fVar36 = pvVar5[uVar15].m_variance;
          uVar31 = pvVar5[uVar15].m_begin;
          iVar13 = pvVar5[uVar15].m_left;
          iVar10 = pvVar5[uVar15].m_right;
          iVar11 = pvVar5[uVar15].m_codebook_index;
          pvVar5[uVar2].m_end = pvVar5[uVar15].m_end;
          pvVar5[uVar2].m_left = iVar13;
          pvVar5[uVar2].m_right = iVar10;
          pvVar5[uVar2].m_codebook_index = iVar11;
          pvVar5[uVar2].m_total_weight = uVar21;
          pvVar5[uVar2].m_variance = fVar36;
          pvVar5[uVar2].m_begin = uVar31;
          (this->m_nodes).m_p[*end_node].m_alternative = true;
          local_d8.m_variance = (this->m_nodes).m_p[*end_node].m_variance;
          local_d8.m_index = *end_node;
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
          ::push(node_queue,&local_d8);
          uVar31 = *end_node;
          *end_node = uVar31 + 1;
          pvVar1->m_left = uVar31;
          uVar15 = pvVar1->m_right;
          pvVar5 = (this->m_nodes).m_p;
          uVar2 = *end_node;
          if (uVar2 != uVar15) {
            lVar18 = 0;
            do {
              pvVar5[uVar2].m_centroid.m_s[lVar18] = pvVar5[uVar15].m_centroid.m_s[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
          }
          *(undefined4 *)((long)&pvVar5[uVar2].m_codebook_index + 3) =
               *(undefined4 *)((long)&pvVar5[uVar15].m_codebook_index + 3);
          uVar21 = pvVar5[uVar15].m_total_weight;
          fVar36 = pvVar5[uVar15].m_variance;
          uVar31 = pvVar5[uVar15].m_begin;
          iVar13 = pvVar5[uVar15].m_left;
          iVar10 = pvVar5[uVar15].m_right;
          iVar11 = pvVar5[uVar15].m_codebook_index;
          pvVar5[uVar2].m_end = pvVar5[uVar15].m_end;
          pvVar5[uVar2].m_left = iVar13;
          pvVar5[uVar2].m_right = iVar10;
          pvVar5[uVar2].m_codebook_index = iVar11;
          pvVar5[uVar2].m_total_weight = uVar21;
          pvVar5[uVar2].m_variance = fVar36;
          pvVar5[uVar2].m_begin = uVar31;
          (this->m_nodes).m_p[*end_node].m_alternative = true;
          local_d8.m_variance = (this->m_nodes).m_p[*end_node].m_variance;
          local_d8.m_index = *end_node;
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
          ::push(node_queue,&local_d8);
          uVar31 = *end_node;
          *end_node = uVar31 + 1;
          pvVar1->m_right = uVar31;
          return true;
        }
        return true;
      }
      pvVar1->m_processed = true;
      uVar15 = pvVar1->m_begin;
      uVar14 = (ulong)uVar15;
      uVar2 = pvVar1->m_end;
      uVar28 = 1;
      if ((local_1a8 != (task_pool *)0x0) && (0x3ff < uVar2 - uVar15)) {
        uVar17 = uVar2 - uVar15 >> 9;
        uVar28 = local_1a8->m_num_threads + 1;
        if (uVar17 < uVar28) {
          uVar28 = uVar17;
        }
      }
      local_128 = 0;
      uStack_120 = 0;
      local_118 = 0;
      if (uVar15 < uVar2) {
        fVar36 = -1.0;
        uVar25 = uVar14;
        do {
          pvVar6 = this->m_vectors + (this->m_vectorsInfo).m_p[uVar25].index;
          fVar35 = 0.0;
          lVar18 = 0;
          do {
            fVar39 = pvVar6->m_s[lVar18] - (pvVar1->m_centroid).m_s[lVar18];
            fVar35 = fVar35 + fVar39 * fVar39;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 6);
          if (fVar36 < fVar35) {
            local_118 = *(undefined8 *)(pvVar6->m_s + 4);
            local_128 = *(undefined8 *)pvVar6->m_s;
            uStack_120 = *(undefined8 *)(pvVar6->m_s + 2);
            fVar36 = fVar35;
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar2);
        if (uVar15 < uVar2) {
          fVar36 = -1.0;
          do {
            pvVar6 = this->m_vectors + (this->m_vectorsInfo).m_p[uVar14].index;
            fVar35 = 0.0;
            lVar18 = 0;
            do {
              fVar39 = pvVar6->m_s[lVar18] - *(float *)((long)&local_128 + lVar18 * 4);
              fVar35 = fVar35 + fVar39 * fVar39;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
            if (fVar36 < fVar35) {
              local_38 = *(undefined8 *)(pvVar6->m_s + 4);
              local_48 = *(undefined8 *)pvVar6->m_s;
              uStack_40 = *(undefined8 *)(pvVar6->m_s + 2);
              fVar36 = fVar35;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar2);
        }
      }
      lVar18 = 0;
      do {
        (&local_d8.m_index)[lVar18] =
             (uint)(*(float *)((long)&local_128 + lVar18 * 4) + (pvVar1->m_centroid).m_s[lVar18]);
        lVar18 = lVar18 + 1;
      } while (lVar18 != 6);
      lVar18 = 0;
      do {
        afStack_160[lVar18 + -2] = (float)(&local_d8.m_index)[lVar18] * 0.5;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 6);
      lVar18 = 0;
      do {
        (&local_d8.m_index)[lVar18] =
             (uint)(*(float *)((long)&local_48 + lVar18 * 4) + (pvVar1->m_centroid).m_s[lVar18]);
        lVar18 = lVar18 + 1;
      } while (lVar18 != 6);
      local_110 = end_node;
      local_108 = node_queue;
      lVar18 = 0;
      do {
        *(float *)(local_188 + lVar18 * 4) = (float)(&local_d8.m_index)[lVar18] * 0.5;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 6);
      uVar15 = pvVar1->m_begin;
      uVar14 = (ulong)uVar15;
      uVar2 = pvVar1->m_end;
      uVar25 = (ulong)uVar2;
      if (uVar15 + 2 < uVar2) {
        pvVar20 = &local_d8;
        memset(pvVar20,0,0x90);
        if (uVar15 < uVar2) {
          pvVar6 = this->m_vectors;
          pVVar7 = (this->m_vectorsInfo).m_p;
          do {
            uVar2 = pVVar7[uVar14].index;
            lVar18 = 0;
            do {
              *(float *)(local_1e8 + lVar18 * 4) =
                   pvVar6[uVar2].m_s[lVar18] - (pvVar1->m_centroid).m_s[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
            uVar2 = pVVar7[uVar14].weight;
            lVar18 = 0;
            do {
              *(float *)(local_1c8 + lVar18 * 4) = *(float *)(local_1e8 + lVar18 * 4) * (float)uVar2
              ;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
            lVar18 = 0;
            puVar26 = local_1c8;
            pvVar23 = &local_d8;
            do {
              fVar36 = *(float *)(local_1e8 + lVar18 * 4);
              lVar29 = -6;
              do {
                (&pvVar23[3].m_index)[lVar29] =
                     (uint)(*(float *)(puVar26 + lVar29 * 4 + 0x18) * fVar36 +
                           (float)(&pvVar23[3].m_index)[lVar29]);
                lVar29 = lVar29 + 1;
              } while (lVar18 + lVar29 != 0);
              lVar18 = lVar18 + 1;
              pvVar23 = (value_type *)&pvVar23[3].m_variance;
              puVar26 = puVar26 + 4;
            } while (lVar18 != 6);
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar25);
        }
        uVar14 = pvVar1->m_total_weight;
        lVar18 = 0x90;
        lVar29 = 0;
        do {
          lVar19 = 0;
          pvVar23 = pvVar20;
          do {
            fVar36 = (float)pvVar23->m_index / (float)uVar14;
            pvVar23->m_index = (uint)fVar36;
            *(float *)((long)&pvVar20->m_index + lVar19) = fVar36;
            pvVar23 = (value_type *)&pvVar23->m_variance;
            lVar19 = lVar19 + 0x18;
          } while (lVar18 != lVar19);
          lVar29 = lVar29 + 1;
          pvVar20 = (value_type *)&pvVar20[3].m_variance;
          lVar18 = lVar18 + -0x18;
        } while (lVar29 != 6);
        lVar18 = 1;
        auVar34 = _DAT_001ae090;
        do {
          if (SUB164(auVar34 ^ _DAT_001ae0a0,4) == -0x80000000 &&
              SUB164(auVar34 ^ _DAT_001ae0a0,0) < -0x7ffffffa) {
            *(undefined4 *)(local_1e8 + lVar18 * 4 + -4) = 0x3f800000;
            *(undefined4 *)(local_1e8 + lVar18 * 4) = 0x3f800000;
          }
          lVar29 = auVar34._8_8_;
          auVar34._0_8_ = auVar34._0_8_ + (long)DAT_001b1690;
          auVar34._8_8_ = lVar29 + DAT_001b1690._8_8_;
          lVar18 = lVar18 + 2;
        } while (lVar18 != 7);
        iVar13 = 0;
        do {
          lVar18 = 0;
          fVar36 = 0.0;
          pvVar20 = &local_d8;
          do {
            fVar35 = 0.0;
            lVar29 = 0;
            do {
              fVar35 = fVar35 + *(float *)(local_1e8 + lVar29 * 4) *
                                (float)(&pvVar20->m_index)[lVar29];
              lVar29 = lVar29 + 1;
            } while (lVar29 != 6);
            *(float *)(local_1c8 + lVar18 * 4) = fVar35;
            fVar39 = fVar36;
            if (fVar36 <= fVar35) {
              fVar39 = fVar35;
            }
            fVar36 = fVar35;
            if (lVar18 != 0) {
              fVar36 = fVar39;
            }
            lVar18 = lVar18 + 1;
            pvVar20 = pvVar20 + 3;
          } while (lVar18 != 6);
          if ((fVar39 != 0.0) || (NAN(fVar39))) {
            lVar18 = 0;
            do {
              *(float *)(local_1c8 + lVar18 * 4) =
                   *(float *)(local_1c8 + lVar18 * 4) * (1.0 / fVar39);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
          }
          local_1d8 = local_1b8[0];
          _local_1e8 = _local_1c8;
          auVar34 = _local_1e8;
          local_1e8 = local_1c8._0_4_;
          iVar13 = iVar13 + 1;
        } while (iVar13 != 10);
        dVar33 = (double)((float)local_1e8 * (float)local_1e8);
        lVar18 = 1;
        do {
          dVar33 = dVar33 + (double)(*(float *)(local_1e8 + lVar18 * 4) *
                                    *(float *)(local_1e8 + lVar18 * 4));
          lVar18 = lVar18 + 1;
        } while (lVar18 != 6);
        if ((dVar33 != 0.0) || (NAN(dVar33))) {
          _local_1e8 = auVar34;
          if (dVar33 < 0.0) {
            dVar33 = sqrt(dVar33);
          }
          else {
            dVar33 = SQRT(dVar33);
          }
          lVar18 = 0;
          do {
            *(float *)(local_1e8 + lVar18 * 4) =
                 *(float *)(local_1e8 + lVar18 * 4) * (float)(1.0 / dVar33);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 6);
          uVar15 = pvVar1->m_begin;
          uVar25 = (ulong)pvVar1->m_end;
        }
        _local_1c8 = ZEXT816(0);
        local_1b8[0] = 0;
        local_f8[4] = 0.0;
        local_f8[5] = 0.0;
        local_f8[0] = 0.0;
        local_f8[1] = 0.0;
        local_f8[2] = 0.0;
        local_f8[3] = 0.0;
        if (uVar15 < (uint)uVar25) {
          pVVar7 = (this->m_vectorsInfo).m_p;
          pvVar6 = this->m_vectors;
          pvVar8 = (this->m_weightedVectors).m_p;
          uVar14 = (ulong)uVar15;
          dVar33 = 0.0;
          auVar38 = ZEXT816(0);
          do {
            uVar15 = pVVar7[uVar14].weight;
            uVar2 = pVVar7[uVar14].index;
            lVar18 = 0;
            do {
              local_140[lVar18] = pvVar6[uVar2].m_s[lVar18] - (pvVar1->m_centroid).m_s[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
            fVar36 = local_140[0] * (float)local_1e8;
            lVar18 = 1;
            do {
              fVar36 = fVar36 + local_140[lVar18] * *(float *)(local_1e8 + lVar18 * 4);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
            if (0.0 <= fVar36) {
              lVar18 = 0;
              do {
                local_f8[lVar18] = pvVar8[uVar2].m_s[lVar18] + local_f8[lVar18];
                lVar18 = lVar18 + 1;
              } while (lVar18 != 6);
              dVar33 = dVar33 + (double)uVar15;
            }
            else {
              lVar18 = 0;
              do {
                *(float *)(local_1c8 + lVar18 * 4) =
                     pvVar8[uVar2].m_s[lVar18] + *(float *)(local_1c8 + lVar18 * 4);
                lVar18 = lVar18 + 1;
              } while (lVar18 != 6);
              auVar38._0_8_ = auVar38._0_8_ + (double)uVar15;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar25);
          if ((0.0 < auVar38._0_8_) && (0.0 < dVar33)) {
            lVar18 = 0;
            do {
              local_140[lVar18] = *(float *)(local_1c8 + lVar18 * 4) * (float)(1.0 / auVar38._0_8_);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
            afStack_160[2] = local_140[4];
            afStack_160[3] = local_140[5];
            local_188._36_4_ = local_140[1];
            local_188._32_4_ = local_140[0];
            afStack_160[0] = local_140[2];
            afStack_160[1] = local_140[3];
            lVar18 = 0;
            do {
              local_140[lVar18] = local_f8[lVar18] * (float)(1.0 / dVar33);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
            local_188._16_4_ = local_140[4];
            local_188._20_4_ = local_140[5];
            local_188._4_4_ = local_140[1];
            local_188._0_4_ = local_140[0];
            local_188._8_4_ = local_140[2];
            local_188._12_4_ = local_140[3];
          }
        }
      }
      local_1a0 = pvVar1;
      pvVar27 = &this->m_vectorsInfoRight;
      pvVar30 = &this->m_vectorsInfoLeft;
      iVar13 = 0;
      local_148 = pvVar27;
      local_150 = pvVar30;
      local_100 = (_func_int **)&PTR_execute_task_001db990;
      local_1ec = 1e+10;
      while( true ) {
        pp_Var12 = local_100;
        this_00 = local_1a8;
        uVar14 = (ulong)local_1a0->m_begin;
        local_1d8._0_4_ = 0.0;
        local_1d8._4_4_ = 0.0;
        _local_1e8 = (undefined1  [16])0x0;
        local_1b8[0]._0_4_ = 0.0;
        local_1b8[0]._4_4_ = 0.0;
        _local_1c8 = (undefined1  [16])0x0;
        if (uVar28 < 2) {
          if (local_1a0->m_end <= local_1a0->m_begin) break;
          dVar33 = 0.0;
          dVar37 = 0.0;
          uVar22 = 0;
          uVar32 = 0;
          uVar25 = uVar14;
          uVar16 = uVar14;
          do {
            pVVar7 = (this->m_vectorsInfo).m_p;
            uVar15 = pVVar7[uVar14].index;
            fVar36 = 0.0;
            lVar18 = 0;
            do {
              fVar35 = afStack_160[lVar18 + -2] - this->m_vectors[uVar15].m_s[lVar18];
              fVar36 = fVar36 + fVar35 * fVar35;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
            fVar35 = 0.0;
            lVar18 = 0;
            do {
              fVar39 = *(float *)(local_188 + lVar18 * 4) - this->m_vectors[uVar15].m_s[lVar18];
              fVar35 = fVar35 + fVar39 * fVar39;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
            pvVar6 = (this->m_weightedVectors).m_p;
            lVar18 = 0;
            if (fVar35 <= fVar36) {
              do {
                *(float *)(local_1c8 + lVar18 * 4) =
                     pvVar6[uVar15].m_s[lVar18] + *(float *)(local_1c8 + lVar18 * 4);
                lVar18 = lVar18 + 1;
              } while (lVar18 != 6);
              dVar33 = dVar33 + (this->m_weightedDotProducts).m_p[uVar15];
              uVar22 = uVar22 + pVVar7[uVar14].weight;
              uVar15 = (uint)uVar25;
              uVar25 = (ulong)(uVar15 + 1);
              pvVar24 = pvVar27;
            }
            else {
              do {
                *(float *)(local_1e8 + lVar18 * 4) =
                     pvVar6[uVar15].m_s[lVar18] + *(float *)(local_1e8 + lVar18 * 4);
                lVar18 = lVar18 + 1;
              } while (lVar18 != 6);
              dVar37 = dVar37 + (this->m_weightedDotProducts).m_p[uVar15];
              uVar32 = uVar32 + pVVar7[uVar14].weight;
              uVar15 = (uint)uVar16;
              uVar16 = (ulong)(uVar15 + 1);
              pvVar24 = pvVar30;
            }
            uVar31 = (uint)uVar16;
            pvVar24->m_p[uVar15] = pVVar7[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar14 < local_1a0->m_end);
        }
        else {
          local_190 = (vq_node *)CONCAT44(local_190._4_4_,iVar13);
          local_d8 = (value_type)((long)local_188 + 0x20);
          local_d0 = local_188;
          local_c8 = local_1a0->m_begin;
          local_c4 = local_1a0->m_end;
          uVar21 = 0;
          local_198 = uVar14;
          local_c0 = uVar28;
          do {
            pObj = (executable_task *)crnlib_malloc(0x28);
            pObj->_vptr_executable_task = pp_Var12;
            pObj[1]._vptr_executable_task = (_func_int **)this;
            pObj[2]._vptr_executable_task = (_func_int **)distance_comparison_task;
            pObj[3]._vptr_executable_task = (_func_int **)0x0;
            *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
            task_pool::queue_task(this_00,pObj,uVar21,&local_d8);
            uVar21 = uVar21 + 1;
          } while (uVar21 < local_c0);
          task_pool::join(this_00);
          uVar14 = (ulong)local_1a0->m_begin;
          pvVar27 = local_148;
          pvVar30 = local_150;
          iVar13 = (int)local_190;
          if (local_1a0->m_begin < local_1a0->m_end) {
            dVar33 = 0.0;
            dVar37 = 0.0;
            uVar16 = local_198 & 0xffffffff;
            uVar22 = 0;
            uVar32 = 0;
            uVar25 = local_198;
            do {
              pVVar7 = (this->m_vectorsInfo).m_p;
              uVar15 = pVVar7[uVar14].index;
              pvVar6 = (this->m_weightedVectors).m_p;
              if ((this->m_vectorComparison).m_p[uVar14] == false) {
                lVar18 = 0;
                do {
                  *(float *)(local_1c8 + lVar18 * 4) =
                       pvVar6[uVar15].m_s[lVar18] + *(float *)(local_1c8 + lVar18 * 4);
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 6);
                dVar33 = dVar33 + (this->m_weightedDotProducts).m_p[uVar15];
                uVar22 = uVar22 + pVVar7[uVar14].weight;
                uVar15 = (uint)uVar16;
                uVar16 = (ulong)(uVar15 + 1);
                pvVar24 = local_148;
              }
              else {
                lVar18 = 0;
                do {
                  *(float *)(local_1e8 + lVar18 * 4) =
                       pvVar6[uVar15].m_s[lVar18] + *(float *)(local_1e8 + lVar18 * 4);
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 6);
                dVar37 = dVar37 + (this->m_weightedDotProducts).m_p[uVar15];
                uVar32 = uVar32 + pVVar7[uVar14].weight;
                uVar15 = (uint)uVar25;
                uVar25 = (ulong)(uVar15 + 1);
                pvVar24 = local_150;
              }
              uVar31 = (uint)uVar25;
              pvVar24->m_p[uVar15] = pVVar7[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar14 < local_1a0->m_end);
          }
          else {
            dVar37 = 0.0;
            uVar32 = 0;
            uVar22 = 0;
            dVar33 = 0.0;
            uVar31 = (uint)local_198;
          }
        }
        this_01 = local_108;
        pvVar1 = local_1a0;
        if ((uVar32 == 0) || (uVar22 == 0)) break;
        fVar36 = (float)local_1e8 * (float)local_1e8;
        lVar18 = 1;
        do {
          fVar36 = fVar36 + *(float *)(local_1e8 + lVar18 * 4) * *(float *)(local_1e8 + lVar18 * 4);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 6);
        fVar35 = (float)local_1c8._0_4_ * (float)local_1c8._0_4_;
        lVar18 = 1;
        do {
          fVar35 = fVar35 + *(float *)(local_1c8 + lVar18 * 4) * *(float *)(local_1c8 + lVar18 * 4);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 6);
        lVar18 = 0;
        do {
          *(float *)(local_1e8 + lVar18 * 4) =
               *(float *)(local_1e8 + lVar18 * 4) * (1.0 / (float)uVar32);
          auVar34 = _local_1e8;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 6);
        local_d8.m_variance = (float)(dVar37 - (double)(fVar36 / (float)uVar32));
        lVar18 = 0;
        do {
          *(float *)(local_1c8 + lVar18 * 4) =
               *(float *)(local_1c8 + lVar18 * 4) * (1.0 / (float)uVar22);
          auVar38 = _local_1c8;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 6);
        afStack_160[2] = (float)local_1d8;
        afStack_160[3] = local_1d8._4_4_;
        local_188._32_4_ = local_1e8;
        local_188._36_4_ = afStack_1e4[0];
        afStack_160[0] = afStack_1e4[1];
        afStack_160[1] = afStack_1e4[2];
        local_188._0_8_ = local_1c8;
        local_188._8_4_ = afStack_1c0[0];
        local_188._12_4_ = afStack_1c0[1];
        local_188._16_4_ = (float)local_1b8[0];
        local_188._20_4_ = local_1b8[0]._4_4_;
        fVar35 = (float)(dVar33 - (double)(fVar35 / (float)uVar22));
        fVar36 = local_d8.m_variance + fVar35;
        if (((fVar36 < 1e-05) || ((local_1ec - fVar36) / fVar36 < 1e-05)) ||
           (iVar13 = iVar13 + 1, local_1ec = fVar36, iVar13 == 0x400)) {
          uVar3 = *local_110;
          *local_110 = uVar3 + 1;
          local_1a0->m_left = uVar3;
          uVar3 = *local_110;
          *local_110 = uVar3 + 1;
          local_1a0->m_right = uVar3;
          local_d8.m_index = local_1a0->m_left;
          local_1a8 = (task_pool *)CONCAT44(local_1a8._4_4_,fVar35);
          local_1ec = local_d8.m_variance;
          _local_1e8 = auVar34;
          _local_1c8 = auVar38;
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
          ::push(local_108,&local_d8);
          local_d8.m_variance = local_1a8._0_4_;
          local_d8.m_index = pvVar1->m_right;
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
          ::push(this_01,&local_d8);
          uVar15 = pvVar1->m_left;
          pvVar9 = (this->m_nodes).m_p;
          pvVar5 = pvVar9 + uVar15;
          uVar14 = (ulong)(uint)pvVar1->m_right;
          local_198 = uVar14 * 0x40;
          local_190 = pvVar9 + uVar14;
          pvVar9[uVar15].m_begin = pvVar1->m_begin;
          pvVar9[uVar14].m_begin = uVar31;
          pvVar9[uVar15].m_end = uVar31;
          pvVar9[uVar14].m_end = pvVar1->m_end;
          memcpy((this->m_vectorsInfo).m_p + pvVar9[uVar15].m_begin,
                 (this->m_vectorsInfoLeft).m_p + pvVar1->m_begin,
                 (ulong)(pvVar9[uVar15].m_end - pvVar9[uVar15].m_begin) << 3);
          uVar15 = *(uint *)((long)(&pvVar9->m_centroid + 1) + local_198 + 0xc);
          memcpy((this->m_vectorsInfo).m_p + uVar15,(this->m_vectorsInfoRight).m_p + pvVar1->m_begin
                 ,(ulong)(*(int *)((long)(&pvVar9->m_centroid + 1) + local_198 + 0x10) - uVar15) <<
                  3);
          if (pvVar5 != (vq_node *)(local_188 + 0x20)) {
            lVar18 = 0;
            do {
              (pvVar5->m_centroid).m_s[lVar18] = afStack_160[lVar18 + -2];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
          }
          pvVar5->m_total_weight = uVar32;
          pvVar5->m_variance = local_1ec;
          if (local_190 != (vq_node *)local_188) {
            lVar18 = 0;
            do {
              (local_190->m_centroid).m_s[lVar18] = *(float *)(local_188 + lVar18 * 4);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 6);
          }
          local_190->m_total_weight = uVar22;
          local_190->m_variance = local_1a8._0_4_;
          return true;
        }
      }
      local_1a0->m_unsplittable = true;
      return true;
    }
  }
  return false;
}

Assistant:

bool split_node(std::priority_queue<NodeInfo>& node_queue, uint& end_node, task_pool* pTask_pool = 0) {
    if (node_queue.empty())
      return false;

    vq_node& parent_node = m_nodes[node_queue.top().m_index];

    if (parent_node.m_alternative)
      parent_node.m_alternative = false;

    if (parent_node.m_variance <= 0.0f || parent_node.m_begin + 1 == parent_node.m_end)
      return false;

    node_queue.pop();

    if (parent_node.m_processed) {
      if (!parent_node.m_unsplittable) {
        m_nodes[end_node] = m_nodes[parent_node.m_left];
        m_nodes[end_node].m_alternative = true;
        node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
        parent_node.m_left = end_node++;
        m_nodes[end_node] = m_nodes[parent_node.m_right];
        m_nodes[end_node].m_alternative = true;
        node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
        parent_node.m_right = end_node++;
      }
      return true;
    }
    parent_node.m_processed = true;

    uint num_blocks = (parent_node.m_end - parent_node.m_begin) >> 9;
    uint num_tasks = num_blocks > 1 && pTask_pool ? math::minimum(num_blocks, pTask_pool->get_num_threads() + 1) : 1;

    VectorType furthest(0);
    double furthest_dist = -1.0f;

    for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
      const VectorType& v = m_vectors[m_vectorsInfo[i].index];
      double dist = v.squared_distance(parent_node.m_centroid);
      if (dist > furthest_dist) {
        furthest_dist = dist;
        furthest = v;
      }
    }

    VectorType opposite;
    double opposite_dist = -1.0f;

    for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
      const VectorType& v = m_vectors[m_vectorsInfo[i].index];
      double dist = v.squared_distance(furthest);
      if (dist > opposite_dist) {
        opposite_dist = dist;
        opposite = v;
      }
    }

    VectorType left_child((furthest + parent_node.m_centroid) * .5f);
    VectorType right_child((opposite + parent_node.m_centroid) * .5f);

    if (parent_node.m_begin + 2 < parent_node.m_end) {
      const uint N = VectorType::num_elements;

      matrix<N, N, float> covar;
      covar.clear();

      for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
        const VectorType& v = m_vectors[m_vectorsInfo[i].index] - parent_node.m_centroid;
        const VectorType w = v * (float)m_vectorsInfo[i].weight;
        for (uint x = 0; x < N; x++) {
          for (uint y = x; y < N; y++)
            covar[x][y] = covar[x][y] + v[x] * w[y];
        }
      }

      float divider = (float)parent_node.m_total_weight;
      for (uint x = 0; x < N; x++) {
        for (uint y = x; y < N; y++) {
          covar[x][y] /= divider;
          covar[y][x] = covar[x][y];
        }
      }

      VectorType axis(1.0f);
      // Starting with an estimate of the principle axis should work better, but doesn't in practice?
      //left_child - right_child);
      //axis.normalize();

      for (uint iter = 0; iter < 10; iter++) {
        VectorType x;

        double max_sum = 0;

        for (uint i = 0; i < N; i++) {
          double sum = 0;

          for (uint j = 0; j < N; j++)
            sum += axis[j] * covar[i][j];

          x[i] = (float)sum;

          max_sum = i ? math::maximum(max_sum, sum) : sum;
        }

        if (max_sum != 0.0f)
          x *= (float)(1.0f / max_sum);

        axis = x;
      }

      axis.normalize();

      VectorType new_left_child(0.0f);
      VectorType new_right_child(0.0f);

      double left_weight = 0.0f;
      double right_weight = 0.0f;

      for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
        const VectorInfo& vectorInfo = m_vectorsInfo[i];
        const float weight = (float)vectorInfo.weight;
        double t = (m_vectors[vectorInfo.index] - parent_node.m_centroid) * axis;
        if (t < 0.0f) {
          new_left_child += m_weightedVectors[vectorInfo.index];
          left_weight += weight;
        } else {
          new_right_child += m_weightedVectors[vectorInfo.index];
          right_weight += weight;
        }
      }

      if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
        left_child = new_left_child * (float)(1.0f / left_weight);
        right_child = new_right_child * (float)(1.0f / right_weight);
      }
    }

    uint64 left_weight = 0;
    uint64 right_weight = 0;

    uint left_info_index = 0;
    uint right_info_index = 0;

    float prev_total_variance = 1e+10f;

    float left_variance = 0.0f;
    float right_variance = 0.0f;

    // FIXME: Excessive upper limit
    const uint cMaxLoops = 1024;
    for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++) {
      left_info_index = right_info_index = parent_node.m_begin;

      VectorType new_left_child(cClear);
      VectorType new_right_child(cClear);

      double left_ttsum = 0.0f;
      double right_ttsum = 0.0f;

      left_weight = 0;
      right_weight = 0;

      if (num_tasks > 1) {
        distance_comparison_task_params params;
        params.left_child = &left_child;
        params.right_child = &right_child;
        params.begin = parent_node.m_begin;
        params.end = parent_node.m_end;
        params.num_tasks = num_tasks;

        for (uint task = 0; task < params.num_tasks; task++)
          pTask_pool->queue_object_task(this, &tree_clusterizer::distance_comparison_task, task, &params);
        pTask_pool->join();

        for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
          const VectorInfo& vectorInfo = m_vectorsInfo[i];
          if (m_vectorComparison[i]) {
            new_left_child += m_weightedVectors[vectorInfo.index];
            left_ttsum += m_weightedDotProducts[vectorInfo.index];
            left_weight += vectorInfo.weight;
            m_vectorsInfoLeft[left_info_index++] = vectorInfo;
          } else {
            new_right_child += m_weightedVectors[vectorInfo.index];
            right_ttsum += m_weightedDotProducts[vectorInfo.index];
            right_weight += vectorInfo.weight;
            m_vectorsInfoRight[right_info_index++] = vectorInfo;
          }
        }
      } else {
        for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
          const VectorInfo& vectorInfo = m_vectorsInfo[i];
          double left_dist2 = left_child.squared_distance(m_vectors[vectorInfo.index]);
          double right_dist2 = right_child.squared_distance(m_vectors[vectorInfo.index]);
          if (left_dist2 < right_dist2) {
            new_left_child += m_weightedVectors[vectorInfo.index];
            left_ttsum += m_weightedDotProducts[vectorInfo.index];
            left_weight += vectorInfo.weight;
            m_vectorsInfoLeft[left_info_index++] = vectorInfo;
          } else {
            new_right_child += m_weightedVectors[vectorInfo.index];
            right_ttsum += m_weightedDotProducts[vectorInfo.index];
            right_weight += vectorInfo.weight;
            m_vectorsInfoRight[right_info_index++] = vectorInfo;
          }
        }
      }

      if ((!left_weight) || (!right_weight)) {
        parent_node.m_unsplittable = true;
        return true;
      }

      left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
      right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));

      new_left_child *= (1.0f / left_weight);
      new_right_child *= (1.0f / right_weight);

      left_child = new_left_child;
      right_child = new_right_child;

      float total_variance = left_variance + right_variance;
      if (total_variance < .00001f)
        break;

      if (((prev_total_variance - total_variance) / total_variance) < .00001f)
        break;

      prev_total_variance = total_variance;
    }

    parent_node.m_left = end_node++;
    parent_node.m_right = end_node++;

    node_queue.push(NodeInfo(parent_node.m_left, left_variance));
    node_queue.push(NodeInfo(parent_node.m_right, right_variance));

    vq_node& left_child_node = m_nodes[parent_node.m_left];
    vq_node& right_child_node = m_nodes[parent_node.m_right];

    left_child_node.m_begin = parent_node.m_begin;
    left_child_node.m_end = right_child_node.m_begin = left_info_index;
    right_child_node.m_end = parent_node.m_end;

    memcpy(&m_vectorsInfo[left_child_node.m_begin], &m_vectorsInfoLeft[parent_node.m_begin], (left_child_node.m_end - left_child_node.m_begin) * sizeof(VectorInfo));
    memcpy(&m_vectorsInfo[right_child_node.m_begin], &m_vectorsInfoRight[parent_node.m_begin], (right_child_node.m_end - right_child_node.m_begin) * sizeof(VectorInfo));

    left_child_node.m_centroid = left_child;
    left_child_node.m_total_weight = left_weight;
    left_child_node.m_variance = left_variance;

    right_child_node.m_centroid = right_child;
    right_child_node.m_total_weight = right_weight;
    right_child_node.m_variance = right_variance;

    return true;
  }